

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_if.cc
# Opt level: O0

unique_ptr<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>_>
 __thiscall absl::time_internal::cctz::TimeZoneIf::Load(TimeZoneIf *this,string *name)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TimeZoneInfo *this_01;
  pointer pTVar3;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  size_type in_stack_ffffffffffffff90;
  unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
  local_50;
  unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
  tz;
  string local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = (string *)this;
  iVar2 = std::__cxx11::string::compare((ulong)name,0,(char *)0x5);
  if (iVar2 == 0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new(0x10);
    tz._M_t.
    super___uniq_ptr_impl<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
    .super__Head_base<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_false>._M_head_impl._3_1_ = 1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (this_00,in_stack_ffffffffffffff90,
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    TimeZoneLibC::TimeZoneLibC((TimeZoneLibC *)this_00,&local_38);
    tz._M_t.
    super___uniq_ptr_impl<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
    .super__Head_base<0UL,_absl::time_internal::cctz::TimeZoneInfo_*,_false>._M_head_impl._3_1_ = 0;
    std::
    unique_ptr<absl::time_internal::cctz::TimeZoneIf,std::default_delete<absl::time_internal::cctz::TimeZoneIf>>
    ::unique_ptr<std::default_delete<absl::time_internal::cctz::TimeZoneIf>,void>
              ((unique_ptr<absl::time_internal::cctz::TimeZoneIf,std::default_delete<absl::time_internal::cctz::TimeZoneIf>>
                *)this,(pointer)this_00);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    this_01 = (TimeZoneInfo *)operator_new(0xc0);
    TimeZoneInfo::TimeZoneInfo(this_01);
    std::
    unique_ptr<absl::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::time_internal::cctz::TimeZoneInfo>>
    ::unique_ptr<std::default_delete<absl::time_internal::cctz::TimeZoneInfo>,void>
              ((unique_ptr<absl::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::time_internal::cctz::TimeZoneInfo>>
                *)&local_50,this_01);
    pTVar3 = std::
             unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
             ::operator->(&local_50);
    bVar1 = TimeZoneInfo::Load(pTVar3,local_18);
    if (!bVar1) {
      std::
      unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
      ::reset(&local_50,(pointer)0x0);
    }
    pTVar3 = std::
             unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
             ::release(&local_50);
    std::
    unique_ptr<absl::time_internal::cctz::TimeZoneIf,std::default_delete<absl::time_internal::cctz::TimeZoneIf>>
    ::unique_ptr<std::default_delete<absl::time_internal::cctz::TimeZoneIf>,void>
              ((unique_ptr<absl::time_internal::cctz::TimeZoneIf,std::default_delete<absl::time_internal::cctz::TimeZoneIf>>
                *)this,&pTVar3->super_TimeZoneIf);
    std::
    unique_ptr<absl::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::time_internal::cctz::TimeZoneInfo>_>
    ::~unique_ptr(&local_50);
  }
  return (__uniq_ptr_data<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>,_true,_true>
          )(__uniq_ptr_data<absl::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::time_internal::cctz::TimeZoneIf>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneIf> TimeZoneIf::Load(const std::string& name) {
  // Support "libc:localtime" and "libc:*" to access the legacy
  // localtime and UTC support respectively from the C library.
  if (name.compare(0, 5, "libc:") == 0) {
    return std::unique_ptr<TimeZoneIf>(new TimeZoneLibC(name.substr(5)));
  }

  // Otherwise use the "zoneinfo" implementation by default.
  std::unique_ptr<TimeZoneInfo> tz(new TimeZoneInfo);
  if (!tz->Load(name)) tz.reset();
  return std::unique_ptr<TimeZoneIf>(tz.release());
}